

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

ostream * deqp::gles31::Functional::operator<<(ostream *str,VarValue *varValue)

{
  VarValue *pVVar1;
  char *pcVar2;
  ostream *poVar3;
  HexBool local_3c;
  deUint64 local_38;
  HexFloat local_2c;
  int local_28;
  int local_24;
  int compNdx;
  int numComponents;
  DataType scalarType;
  DataType basicType;
  VarValue *varValue_local;
  ostream *str_local;
  
  _scalarType = varValue;
  varValue_local = (VarValue *)str;
  numComponents = glu::VarType::getBasicType(varValue->type);
  compNdx = glu::getDataTypeScalarType(numComponents);
  local_24 = glu::getDataTypeScalarSize(numComponents);
  pVVar1 = varValue_local;
  if (1 < local_24) {
    pcVar2 = glu::getDataTypeName(numComponents);
    poVar3 = std::operator<<((ostream *)pVVar1,pcVar2);
    std::operator<<(poVar3,"(");
  }
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    if (local_28 != 0) {
      std::operator<<((ostream *)varValue_local,", ");
    }
    pVVar1 = varValue_local;
    switch(compNdx) {
    case 1:
      HexFloat::HexFloat(&local_2c,*(float *)((long)_scalarType->value + (long)local_28 * 4));
      operator<<((ostream *)pVVar1,&local_2c);
      break;
    default:
      break;
    case 0x1b:
      std::ostream::operator<<
                (varValue_local,*(int *)((long)_scalarType->value + (long)local_28 * 4));
      break;
    case 0x1f:
      local_38 = (deUint64)
                 tcu::toHex<unsigned_int>(*(uint *)((long)_scalarType->value + (long)local_28 * 4));
      tcu::Format::operator<<((ostream *)pVVar1,(Hex<8UL>)local_38);
      break;
    case 0x23:
      HexBool::HexBool(&local_3c,*(deUint32 *)((long)_scalarType->value + (long)local_28 * 4));
      operator<<((ostream *)pVVar1,&local_3c);
    }
  }
  if (1 < local_24) {
    std::operator<<((ostream *)varValue_local,")");
  }
  return (ostream *)varValue_local;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const VarValue& varValue)
{
	DE_ASSERT(varValue.type.isBasicType());

	const glu::DataType		basicType		= varValue.type.getBasicType();
	const glu::DataType		scalarType		= glu::getDataTypeScalarType(basicType);
	const int				numComponents	= glu::getDataTypeScalarSize(basicType);

	if (numComponents > 1)
		str << glu::getDataTypeName(basicType) << "(";

	for (int compNdx = 0; compNdx < numComponents; compNdx++)
	{
		if (compNdx != 0)
			str << ", ";

		switch (scalarType)
		{
			case glu::TYPE_FLOAT:	str << HexFloat(((const float*)varValue.value)[compNdx]);			break;
			case glu::TYPE_INT:		str << ((const deInt32*)varValue.value)[compNdx];					break;
			case glu::TYPE_UINT:	str << tcu::toHex(((const deUint32*)varValue.value)[compNdx]);		break;
			case glu::TYPE_BOOL:	str << HexBool(((const deUint32*)varValue.value)[compNdx]);			break;

			default:
				DE_ASSERT(false);
		}
	}

	if (numComponents > 1)
		str << ")";

	return str;
}